

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  byte bVar1;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  uint extraout_EAX;
  uchar *data;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  data = (uchar *)malloc(7);
  if (data != (uchar *)0x0) {
    uVar5 = (ushort)time->year;
    uVar6 = (ushort)time->month;
    uVar7 = (ushort)time->day;
    uVar8 = (ushort)time->hour;
    *data = (uchar)(time->year >> 8);
    uVar10 = uVar5 & 0xff;
    uVar11 = uVar6 & 0xff;
    uVar12 = uVar7 & 0xff;
    uVar13 = uVar8 & 0xff;
    bVar1 = (uVar10 != 0) * (uVar10 < 0x100) * (char)uVar5 - (0xff < uVar10);
    bVar2 = (uVar11 != 0) * (uVar11 < 0x100) * (char)uVar6 - (0xff < uVar11);
    bVar3 = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar7 - (0xff < uVar12);
    bVar4 = (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar8 - (0xff < uVar13);
    *(uint *)(data + 1) =
         CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                  CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                    (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
    data[5] = (uchar)time->minute;
    data[6] = (uchar)time->second;
    uVar9 = lodepng_chunk_create(&out->data,&out->size,7,"tIME",data);
    if (uVar9 == 0) {
      out->allocsize = out->size;
    }
    free(data);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time)
{
  unsigned error = 0;
  unsigned char* data = (unsigned char*)lodepng_malloc(7);
  if(!data) return 83; /*alloc fail*/
  data[0] = (unsigned char)(time->year / 256);
  data[1] = (unsigned char)(time->year % 256);
  data[2] = (unsigned char)time->month;
  data[3] = (unsigned char)time->day;
  data[4] = (unsigned char)time->hour;
  data[5] = (unsigned char)time->minute;
  data[6] = (unsigned char)time->second;
  error = addChunk(out, "tIME", data, 7);
  lodepng_free(data);
  return error;
}